

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O1

void realize_virt_arrays(j_common_ptr cinfo)

{
  jpeg_memory_mgr *pjVar1;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var2;
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var3;
  long lVar4;
  JSAMPARRAY ppJVar5;
  JBLOCKARRAY ppaJVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long max_bytes_needed;
  
  pjVar1 = cinfo->mem;
  p_Var2 = pjVar1[1].request_virt_sarray;
  if (p_Var2 == (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)
                0x0) {
    max_bytes_needed = 0;
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    max_bytes_needed = 0;
    do {
      if (*(long *)p_Var2 == 0) {
        lVar9 = lVar9 + (ulong)*(uint *)(p_Var2 + 0x10) * (ulong)*(uint *)(p_Var2 + 0xc);
        max_bytes_needed =
             max_bytes_needed + (ulong)*(uint *)(p_Var2 + 8) * (ulong)*(uint *)(p_Var2 + 0xc);
      }
      p_Var2 = *(_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **
                )(p_Var2 + 0x30);
    } while (p_Var2 != (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                        *)0x0);
  }
  for (p_Var3 = pjVar1[1].request_virt_barray;
      p_Var3 != (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)
                0x0;
      p_Var3 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION **
                )(p_Var3 + 0x30)) {
    if (*(long *)p_Var3 == 0) {
      lVar9 = lVar9 + (ulong)*(uint *)(p_Var3 + 0x10) * (ulong)*(uint *)(p_Var3 + 0xc) * 0x80;
      max_bytes_needed =
           max_bytes_needed + (ulong)*(uint *)(p_Var3 + 8) * (ulong)*(uint *)(p_Var3 + 0xc) * 0x80;
    }
  }
  if (0 < lVar9) {
    lVar4 = jpeg_mem_available(cinfo,lVar9,max_bytes_needed,(long)pjVar1[1].realize_virt_arrays);
    lVar8 = 1000000000;
    if (lVar4 < max_bytes_needed) {
      lVar8 = 1;
      if (1 < lVar4 / lVar9) {
        lVar8 = lVar4 / lVar9;
      }
    }
    for (p_Var2 = pjVar1[1].request_virt_sarray;
        p_Var2 != (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   *)0x0;
        p_Var2 = *(_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(p_Var2 + 0x30)) {
      if (*(long *)p_Var2 == 0) {
        uVar7 = *(uint *)(p_Var2 + 8);
        lVar9 = 0x14;
        if (lVar8 <= (long)((ulong)uVar7 - 1) / (long)(ulong)*(uint *)(p_Var2 + 0x10)) {
          *(uint *)(p_Var2 + 0x14) = *(uint *)(p_Var2 + 0x10) * (int)lVar8;
          jpeg_open_backing_store
                    (cinfo,(backing_store_ptr)(p_Var2 + 0x38),
                     (ulong)*(uint *)(p_Var2 + 0xc) * (ulong)uVar7);
          uVar7 = 1;
          lVar9 = 0x2c;
        }
        *(uint *)(p_Var2 + lVar9) = uVar7;
        ppJVar5 = alloc_sarray(cinfo,1,*(JDIMENSION *)(p_Var2 + 0xc),*(JDIMENSION *)(p_Var2 + 0x14))
        ;
        *(JSAMPARRAY *)p_Var2 = ppJVar5;
        *(undefined4 *)(p_Var2 + 0x18) = *(undefined4 *)&pjVar1[1].access_virt_sarray;
        *(undefined8 *)(p_Var2 + 0x1c) = 0;
        *(undefined4 *)(p_Var2 + 0x28) = 0;
      }
    }
    for (p_Var3 = pjVar1[1].request_virt_barray;
        p_Var3 != (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   *)0x0;
        p_Var3 = *(_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION
                   **)(p_Var3 + 0x30)) {
      if (*(long *)p_Var3 == 0) {
        uVar7 = *(uint *)(p_Var3 + 8);
        lVar9 = 0x14;
        if (lVar8 <= (long)((ulong)uVar7 - 1) / (long)(ulong)*(uint *)(p_Var3 + 0x10)) {
          *(uint *)(p_Var3 + 0x14) = *(uint *)(p_Var3 + 0x10) * (int)lVar8;
          jpeg_open_backing_store
                    (cinfo,(backing_store_ptr)(p_Var3 + 0x38),
                     (ulong)*(uint *)(p_Var3 + 0xc) * (ulong)uVar7 * 0x80);
          uVar7 = 1;
          lVar9 = 0x2c;
        }
        *(uint *)(p_Var3 + lVar9) = uVar7;
        ppaJVar6 = alloc_barray(cinfo,1,*(JDIMENSION *)(p_Var3 + 0xc),*(JDIMENSION *)(p_Var3 + 0x14)
                               );
        *(JBLOCKARRAY *)p_Var3 = ppaJVar6;
        *(undefined4 *)(p_Var3 + 0x18) = *(undefined4 *)&pjVar1[1].access_virt_sarray;
        *(undefined8 *)(p_Var3 + 0x1c) = 0;
        *(undefined4 *)(p_Var3 + 0x28) = 0;
      }
    }
  }
  return;
}

Assistant:

METHODDEF(void)
realize_virt_arrays (j_common_ptr cinfo)
/* Allocate the in-memory buffers for any unrealized virtual arrays */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  long space_per_minheight, maximum_space, avail_mem;
  long minheights, max_minheights;
  jvirt_sarray_ptr sptr;
  jvirt_barray_ptr bptr;

  /* Compute the minimum space needed (maxaccess rows in each buffer)
   * and the maximum space needed (full image height in each buffer).
   * These may be of use to the system-dependent jpeg_mem_available routine.
   */
  space_per_minheight = 0;
  maximum_space = 0;
  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      space_per_minheight += (long) sptr->maxaccess *
			     (long) sptr->samplesperrow * SIZEOF(JSAMPLE);
      maximum_space += (long) sptr->rows_in_array *
		       (long) sptr->samplesperrow * SIZEOF(JSAMPLE);
    }
  }
  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      space_per_minheight += (long) bptr->maxaccess *
			     (long) bptr->blocksperrow * SIZEOF(JBLOCK);
      maximum_space += (long) bptr->rows_in_array *
		       (long) bptr->blocksperrow * SIZEOF(JBLOCK);
    }
  }

  if (space_per_minheight <= 0)
    return;			/* no unrealized arrays, no work */

  /* Determine amount of memory to actually use; this is system-dependent. */
  avail_mem = jpeg_mem_available(cinfo, space_per_minheight, maximum_space,
				 mem->total_space_allocated);

  /* If the maximum space needed is available, make all the buffers full
   * height; otherwise parcel it out with the same number of minheights
   * in each buffer.
   */
  if (avail_mem >= maximum_space)
    max_minheights = 1000000000L;
  else {
    max_minheights = avail_mem / space_per_minheight;
    /* If there doesn't seem to be enough space, try to get the minimum
     * anyway.  This allows a "stub" implementation of jpeg_mem_available().
     */
    if (max_minheights <= 0)
      max_minheights = 1;
  }

  /* Allocate the in-memory buffers and initialize backing store as needed. */

  for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
    if (sptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long) sptr->rows_in_array - 1L) / sptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
	/* This buffer fits in memory */
	sptr->rows_in_mem = sptr->rows_in_array;
      } else {
	/* It doesn't fit in memory, create backing store. */
	sptr->rows_in_mem = (JDIMENSION) (max_minheights * sptr->maxaccess);
	jpeg_open_backing_store(cinfo, & sptr->b_s_info,
				(long) sptr->rows_in_array *
				(long) sptr->samplesperrow *
				(long) SIZEOF(JSAMPLE));
	sptr->b_s_open = TRUE;
      }
      sptr->mem_buffer = alloc_sarray(cinfo, JPOOL_IMAGE,
				      sptr->samplesperrow, sptr->rows_in_mem);
      sptr->rowsperchunk = mem->last_rowsperchunk;
      sptr->cur_start_row = 0;
      sptr->first_undef_row = 0;
      sptr->dirty = FALSE;
    }
  }

  for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
    if (bptr->mem_buffer == NULL) { /* if not realized yet */
      minheights = ((long) bptr->rows_in_array - 1L) / bptr->maxaccess + 1L;
      if (minheights <= max_minheights) {
	/* This buffer fits in memory */
	bptr->rows_in_mem = bptr->rows_in_array;
      } else {
	/* It doesn't fit in memory, create backing store. */
	bptr->rows_in_mem = (JDIMENSION) (max_minheights * bptr->maxaccess);
	jpeg_open_backing_store(cinfo, & bptr->b_s_info,
				(long) bptr->rows_in_array *
				(long) bptr->blocksperrow *
				(long) SIZEOF(JBLOCK));
	bptr->b_s_open = TRUE;
      }
      bptr->mem_buffer = alloc_barray(cinfo, JPOOL_IMAGE,
				      bptr->blocksperrow, bptr->rows_in_mem);
      bptr->rowsperchunk = mem->last_rowsperchunk;
      bptr->cur_start_row = 0;
      bptr->first_undef_row = 0;
      bptr->dirty = FALSE;
    }
  }
}